

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream_input.cpp
# Opt level: O0

input * mpt::io::stream::input::create(streaminfo *info)

{
  input *this;
  streaminfo *info_local;
  
  this = (input *)operator_new(0x50);
  create(mpt::streaminfo_const*)::stream_input::stream_input(mpt::streaminfo_const__(this,info);
  return this;
}

Assistant:

io::stream::input *io::stream::input::create(const streaminfo *info)
{
	class stream_input : public input
	{
	public:
		inline stream_input(const streaminfo *info) : input(info), _ref(1)
		{ }
		void unref() __MPT_OVERRIDE
		{
			if (_ref.lower()) {
				return;
			}
			delete this;
		}
		uintptr_t addref() __MPT_OVERRIDE
		{
			return _ref.raise();
		}
	private:
		refcount _ref;
	};
	return new stream_input(info);
}